

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::anon_unknown_0::FillTest::testRender(FillTest *this)

{
  ulong uVar1;
  ostringstream *poVar2;
  TextureFormat log;
  long lVar3;
  FillTest *pFVar4;
  RenderTarget *pRVar5;
  RenderTarget *pRVar6;
  ulong uVar7;
  LogImageSet *access;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  ChannelOrder __fd;
  undefined8 uVar9;
  void *pvVar10;
  int iVar11;
  bool bVar12;
  int y;
  undefined1 auVar13 [16];
  uint uVar14;
  Surface refSurface;
  Surface testSurface;
  Surface outputImage;
  Surface diffMask;
  IVec4 cSrc;
  Vector<bool,_4> res;
  IVec4 cTest;
  ReferenceContextBuffers buffers;
  GLContext glesContext;
  ReferenceContext refContext;
  Surface local_6980;
  Surface local_6968;
  string local_6950;
  RenderTarget *local_6930;
  string local_6928;
  string local_6908;
  string local_68e8;
  string local_68c8;
  int local_68a4;
  Surface local_68a0;
  FillTest *local_6888;
  string local_6880;
  undefined1 local_6860 [40];
  undefined1 local_6838 [40];
  TextureFormat local_6810;
  LogImage local_6808;
  string local_6778;
  string local_6758;
  LogImage local_6738;
  LogImage local_66a8;
  LogImageSet local_6618;
  undefined1 local_65d8 [392];
  ConstPixelBufferAccess local_6450;
  undefined1 local_6428 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6408;
  _Alloc_hider local_63f0;
  size_type local_63e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_63e0;
  ReferenceContextBuffers local_63d0;
  GLContext local_6358;
  ReferenceContext local_61e8;
  
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e8.super_Context._vptr_Context = (_func_int **)0x0;
  local_61e8.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  local_61e8.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&local_6358,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e8);
  local_63f0._M_p = (pointer)&local_63e0;
  local_6428._0_4_ = (ApiType)0x3;
  local_6428._4_4_ = 0x10;
  local_6428._8_4_ = 0x800;
  local_6428._12_4_ = 0x800;
  local_6428._16_4_ = 0x100;
  local_6428._20_4_ = 0x100;
  local_6428._24_4_ = 0x800;
  local_6428._28_4_ = 0x10;
  local_6408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_63e8 = 0;
  local_63e0._M_local_buf[0] = '\0';
  pRVar5 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar6 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_63d0,&pRVar5->m_pixelFormat,pRVar6->m_depthBits,0,200,200,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65d8,&local_63d0.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65d8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65d8,&local_63d0.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65d8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65d8,&local_63d0.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65d8);
  sglr::ReferenceContext::ReferenceContext
            (&local_61e8,(ReferenceContextLimits *)local_6428,
             (MultisamplePixelBufferAccess *)&local_6738,(MultisamplePixelBufferAccess *)&local_6808
             ,(MultisamplePixelBufferAccess *)&local_66a8);
  tcu::Surface::Surface(&local_6968,200,200);
  tcu::Surface::Surface(&local_6980,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_6358);
  sglr::Context::readPixels(&local_6358.super_Context,&local_6968,0,0,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_61e8);
  sglr::Context::readPixels(&local_61e8.super_Context,&local_6980,0,0,200,200);
  tcu::Surface::Surface((Surface *)&local_6950,200,200);
  poVar2 = (ostringstream *)(local_65d8 + 8);
  local_65d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Checking for overdraw ",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
  local_6930 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  local_65d8._0_4_ = RGBA;
  local_65d8._4_4_ = UNORM_INT8;
  pvVar10 = (void *)local_6968.m_pixels.m_cap;
  if ((void *)local_6968.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_6968.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6738,(TextureFormat *)local_65d8,local_6968.m_width,
             local_6968.m_height,1,pvVar10);
  local_65d8._0_4_ = RGBA;
  local_65d8._4_4_ = UNORM_INT8;
  uVar9 = local_6950.field_2._M_allocated_capacity;
  if ((void *)local_6950.field_2._M_allocated_capacity != (void *)0x0) {
    uVar9 = local_6950._M_string_length;
  }
  local_6888 = this;
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6808,(TextureFormat *)local_65d8,
             (int)local_6950._M_dataplus._M_p,local_6950._M_dataplus._M_p._4_4_,1,(void *)uVar9);
  tcu::clear((PixelBufferAccess *)&local_6808,(Vec4 *)(anonymous_namespace)::MASK_COLOR_OK);
  __fd = log.order;
  if (0 < local_6738.m_name._M_string_length._4_4_) {
    local_68a4 = local_6738.m_name._M_string_length._4_4_;
    bVar12 = false;
    iVar11 = 0;
    do {
      if (0 < (int)local_6738.m_name._M_string_length) {
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_65d8,(int)&local_6738,y,iVar11);
          if (((local_65d8._0_4_ != R) || (local_65d8._4_4_ != SNORM_INT8)) ||
             (local_65d8._8_4_ != 0)) {
            uVar14 = (int)(local_65d8._0_4_ - 0x7f) >> 0x1f;
            auVar13._0_4_ = -(uint)(0x14 < (int)((local_65d8._0_4_ - 0x7f ^ uVar14) - uVar14));
            auVar13._4_4_ =
                 -(uint)(0x100 < (local_65d8._4_4_ ^ (int)local_65d8._4_4_ >> 0x1f) -
                                 ((int)local_65d8._4_4_ >> 0x1f));
            auVar13._8_4_ =
                 -(uint)(0x100 < (local_65d8._8_4_ ^ (int)local_65d8._8_4_ >> 0x1f) -
                                 ((int)local_65d8._8_4_ >> 0x1f));
            auVar13._12_4_ =
                 -(uint)(0x100 < (local_65d8._12_4_ ^ (int)local_65d8._12_4_ >> 0x1f) -
                                 ((int)local_65d8._12_4_ >> 0x1f));
            auVar13 = packssdw(auVar13,auVar13);
            auVar13 = packsswb(auVar13 ^ _DAT_0064d410,auVar13 ^ _DAT_0064d410);
            uVar14 = auVar13._0_4_ & (uint)DAT_00639710;
            local_66a8.m_name._M_dataplus._M_p._0_4_ = uVar14;
            if ((char)uVar14 != '\0') {
              uVar7 = 0xffffffffffffffff;
              do {
                if (uVar7 == 2) goto LAB_003ba407;
                uVar1 = uVar7 + 1;
                lVar3 = uVar7 - 0x46;
                uVar7 = uVar1;
              } while (*(char *)((long)local_66a8.m_access.m_size.m_data + lVar3) != '\0');
              if (2 < uVar1) goto LAB_003ba407;
            }
            if ((0x7e < (int)(local_65d8._0_4_ + DS)) || (local_6930->m_numSamples < 2)) {
              bVar12 = true;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_6808,
                         (Vec4 *)(anonymous_namespace)::MASK_COLOR_FAIL,y,iVar11,0);
            }
          }
LAB_003ba407:
          y = y + 1;
        } while (y != (int)local_6738.m_name._M_string_length);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != local_68a4);
    if (bVar12) {
      poVar2 = (ostringstream *)(local_65d8 + 8);
      local_65d8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Faulty pixel(s) found.",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
      local_6838._0_8_ = (long)local_6838 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6838,"Images","");
      local_6860._0_8_ = (long)local_6860 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6860,"Image comparison","");
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&local_66a8,(string *)local_6838,(string *)local_6860);
      tcu::TestLog::startImageSet
                ((TestLog *)log,local_66a8.m_name._M_dataplus._M_p,
                 local_66a8.m_description._M_dataplus._M_p);
      local_68c8._M_dataplus._M_p = (pointer)&local_68c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68c8,"TestImage","");
      local_68e8._M_dataplus._M_p = (pointer)&local_68e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68e8,"Test image","");
      local_6808.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar10 = (void *)local_6968.m_pixels.m_cap;
      if ((void *)local_6968.m_pixels.m_cap != (void *)0x0) {
        pvVar10 = local_6968.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_6618,(TextureFormat *)&local_6808,local_6968.m_width,
                 local_6968.m_height,1,pvVar10);
      access = &local_6618;
      tcu::LogImage::LogImage
                (&local_6738,&local_68c8,&local_68e8,(ConstPixelBufferAccess *)access,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_6738,__fd,__buf,(size_t)access);
      local_6908._M_dataplus._M_p = (pointer)&local_6908.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6908,"InvalidPixels","");
      local_6928._M_dataplus._M_p = (pointer)&local_6928.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6928,"Invalid pixels","");
      local_6880._M_dataplus._M_p = (pointer)0x300000008;
      uVar9 = local_6950.field_2._M_allocated_capacity;
      if ((void *)local_6950.field_2._M_allocated_capacity != (void *)0x0) {
        uVar9 = local_6950._M_string_length;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_6450,(TextureFormat *)&local_6880,
                 (int)local_6950._M_dataplus._M_p,local_6950._M_dataplus._M_p._4_4_,1,(void *)uVar9)
      ;
      pCVar8 = &local_6450;
      tcu::LogImage::LogImage
                (&local_6808,&local_6908,&local_6928,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_6808,__fd,__buf_00,(size_t)pCVar8);
      tcu::TestLog::endImageSet((TestLog *)log);
      poVar2 = (ostringstream *)(local_65d8 + 8);
      local_65d8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Got overdraw.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6808.m_description._M_dataplus._M_p != &local_6808.m_description.field_2) {
        operator_delete(local_6808.m_description._M_dataplus._M_p,
                        local_6808.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6808.m_name._M_dataplus._M_p != &local_6808.m_name.field_2) {
        operator_delete(local_6808.m_name._M_dataplus._M_p,
                        local_6808.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6928._M_dataplus._M_p != &local_6928.field_2) {
        operator_delete(local_6928._M_dataplus._M_p,local_6928.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6908._M_dataplus._M_p != &local_6908.field_2) {
        operator_delete(local_6908._M_dataplus._M_p,local_6908.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6738.m_description._M_dataplus._M_p != &local_6738.m_description.field_2) {
        operator_delete(local_6738.m_description._M_dataplus._M_p,
                        local_6738.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6738.m_name._M_dataplus._M_p != &local_6738.m_name.field_2) {
        operator_delete(local_6738.m_name._M_dataplus._M_p,
                        local_6738.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68e8._M_dataplus._M_p != &local_68e8.field_2) {
        operator_delete(local_68e8._M_dataplus._M_p,local_68e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68c8._M_dataplus._M_p != &local_68c8.field_2) {
        operator_delete(local_68c8._M_dataplus._M_p,local_68c8.field_2._M_allocated_capacity + 1);
      }
      pFVar4 = local_6888;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_66a8.m_description._M_dataplus._M_p != &local_66a8.m_description.field_2) {
        operator_delete(local_66a8.m_description._M_dataplus._M_p,
                        local_66a8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_66a8.m_name._M_dataplus._M_p != &local_66a8.m_name.field_2) {
        operator_delete(local_66a8.m_name._M_dataplus._M_p,
                        local_66a8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_6860._0_8_ != (long)local_6860 + 0x10) {
        operator_delete((void *)local_6860._0_8_,local_6860._16_8_ + 1);
      }
      if (local_6838._0_8_ != (long)local_6838 + 0x10) {
        operator_delete((void *)local_6838._0_8_,local_6838._16_8_ + 1);
      }
      tcu::TestContext::setTestResult
                ((pFVar4->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Got overdraw");
    }
  }
  tcu::Surface::~Surface((Surface *)&local_6950);
  tcu::Surface::Surface(&local_68a0,200,200);
  poVar2 = (ostringstream *)(local_65d8 + 8);
  local_65d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Comparing images... ",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
  poVar2 = (ostringstream *)(local_65d8 + 8);
  local_65d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Deviation within radius of ",0x1b);
  std::ostream::operator<<(poVar2,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," is allowed.",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
  local_6738.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar10 = (void *)local_6980.m_pixels.m_cap;
  if ((void *)local_6980.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_6980.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_65d8,(TextureFormat *)&local_6738,local_6980.m_width,
             local_6980.m_height,1,pvVar10);
  local_6808.m_name._M_dataplus._M_p = (char *)0x300000008;
  pvVar10 = (void *)local_6980.m_pixels.m_cap;
  if ((void *)local_6980.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_6980.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6738,(TextureFormat *)&local_6808,local_6980.m_width,
             local_6980.m_height,1,pvVar10);
  local_6930 = (RenderTarget *)CONCAT44(local_6930._4_4_,local_65d8._12_4_);
  if (0 < (int)local_65d8._12_4_) {
    iVar11 = 0;
    do {
      if (0 < (int)local_65d8._8_4_) {
        uVar14 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_6808,(int)local_65d8,uVar14,iVar11);
          local_66a8.m_name._M_dataplus._M_p = local_6808.m_name._M_dataplus._M_p;
          local_66a8.m_name._M_string_length._0_4_ = (undefined4)local_6808.m_name._M_string_length;
          local_66a8.m_name._M_string_length._4_4_ = 0xff;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_6738,(IVec4 *)&local_66a8,uVar14,iVar11,0);
          uVar14 = uVar14 + 1;
        } while (local_65d8._8_4_ != uVar14);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != (int)local_6930);
  }
  local_6738.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar10 = (void *)local_6968.m_pixels.m_cap;
  if ((void *)local_6968.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_6968.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_65d8,(TextureFormat *)&local_6738,local_6968.m_width,
             local_6968.m_height,1,pvVar10);
  local_6808.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar10 = (void *)local_6980.m_pixels.m_cap;
  if ((void *)local_6980.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_6980.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6738,(TextureFormat *)&local_6808,local_6980.m_width,
             local_6980.m_height,1,pvVar10);
  local_66a8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar10 = (void *)local_68a0.m_pixels.m_cap;
  if ((void *)local_68a0.m_pixels.m_cap != (void *)0x0) {
    pvVar10 = local_68a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6808,(TextureFormat *)&local_66a8,local_68a0.m_width,
             local_68a0.m_height,1,pvVar10);
  iVar11 = compareImages((TestLog *)log,(ConstPixelBufferAccess *)local_65d8,
                         (ConstPixelBufferAccess *)&local_6738,(PixelBufferAccess *)&local_6808,1,
                         compareBlackNonBlackPixels);
  if (0 < iVar11) {
    local_68c8._M_dataplus._M_p = (pointer)&local_68c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68c8,"Images","");
    local_68e8._M_dataplus._M_p = (pointer)&local_68e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68e8,"Image comparison","");
    tcu::LogImageSet::LogImageSet(&local_6618,&local_68c8,&local_68e8);
    tcu::TestLog::startImageSet
              ((TestLog *)log,local_6618.m_name._M_dataplus._M_p,
               local_6618.m_description._M_dataplus._M_p);
    local_6908._M_dataplus._M_p = (pointer)&local_6908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6908,"TestImage","");
    local_6928._M_dataplus._M_p = (pointer)&local_6928.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6928,"Test image","");
    local_6808.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6968.m_pixels.m_cap != (void *)0x0) {
      local_6968.m_pixels.m_cap = (size_t)local_6968.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_6450,(TextureFormat *)&local_6808,local_6968.m_width,
               local_6968.m_height,1,(void *)local_6968.m_pixels.m_cap);
    pCVar8 = &local_6450;
    tcu::LogImage::LogImage
              (&local_6738,&local_6908,&local_6928,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6738,__fd,__buf_01,(size_t)pCVar8);
    local_6950._M_dataplus._M_p = (pointer)&local_6950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6950,"ReferenceImage","");
    local_6880._M_dataplus._M_p = (pointer)&local_6880.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6880,"Reference image","");
    local_66a8.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6980.m_pixels.m_cap != (void *)0x0) {
      local_6980.m_pixels.m_cap = (size_t)local_6980.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_6838,(TextureFormat *)&local_66a8,local_6980.m_width,
               local_6980.m_height,1,(void *)local_6980.m_pixels.m_cap);
    pCVar8 = (ConstPixelBufferAccess *)local_6838;
    tcu::LogImage::LogImage
              (&local_6808,&local_6950,&local_6880,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6808,__fd,__buf_02,(size_t)pCVar8);
    local_6758._M_dataplus._M_p = (pointer)&local_6758.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6758,"DifferenceMask","");
    local_6778._M_dataplus._M_p = (pointer)&local_6778.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6778,"Difference mask","");
    local_6810.order = RGBA;
    local_6810.type = UNORM_INT8;
    if ((void *)local_68a0.m_pixels.m_cap != (void *)0x0) {
      local_68a0.m_pixels.m_cap = (size_t)local_68a0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_6860,&local_6810,local_68a0.m_width,local_68a0.m_height,1,
               (void *)local_68a0.m_pixels.m_cap);
    pCVar8 = (ConstPixelBufferAccess *)local_6860;
    tcu::LogImage::LogImage
              (&local_66a8,&local_6758,&local_6778,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_66a8,__fd,__buf_03,(size_t)pCVar8);
    tcu::TestLog::endImageSet((TestLog *)log);
    poVar2 = (ostringstream *)(local_65d8 + 8);
    local_65d8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Got ",4);
    std::ostream::operator<<(poVar2,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_65d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base((ios_base *)(local_65d8 + 0x78));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_66a8.m_description._M_dataplus._M_p != &local_66a8.m_description.field_2) {
      operator_delete(local_66a8.m_description._M_dataplus._M_p,
                      local_66a8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_66a8.m_name._M_dataplus._M_p != &local_66a8.m_name.field_2) {
      operator_delete(local_66a8.m_name._M_dataplus._M_p,
                      local_66a8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6778._M_dataplus._M_p != &local_6778.field_2) {
      operator_delete(local_6778._M_dataplus._M_p,local_6778.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6758._M_dataplus._M_p != &local_6758.field_2) {
      operator_delete(local_6758._M_dataplus._M_p,local_6758.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6808.m_description._M_dataplus._M_p != &local_6808.m_description.field_2) {
      operator_delete(local_6808.m_description._M_dataplus._M_p,
                      local_6808.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6808.m_name._M_dataplus._M_p != &local_6808.m_name.field_2) {
      operator_delete(local_6808.m_name._M_dataplus._M_p,
                      local_6808.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6880._M_dataplus._M_p != &local_6880.field_2) {
      operator_delete(local_6880._M_dataplus._M_p,local_6880.field_2._M_allocated_capacity + 1);
    }
    pFVar4 = local_6888;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6950._M_dataplus._M_p != &local_6950.field_2) {
      operator_delete(local_6950._M_dataplus._M_p,local_6950.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6738.m_description._M_dataplus._M_p != &local_6738.m_description.field_2) {
      operator_delete(local_6738.m_description._M_dataplus._M_p,
                      local_6738.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6738.m_name._M_dataplus._M_p != &local_6738.m_name.field_2) {
      operator_delete(local_6738.m_name._M_dataplus._M_p,
                      local_6738.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6928._M_dataplus._M_p != &local_6928.field_2) {
      operator_delete(local_6928._M_dataplus._M_p,local_6928.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6908._M_dataplus._M_p != &local_6908.field_2) {
      operator_delete(local_6908._M_dataplus._M_p,local_6908.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6618.m_description._M_dataplus._M_p != &local_6618.m_description.field_2) {
      operator_delete(local_6618.m_description._M_dataplus._M_p,
                      local_6618.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6618.m_name._M_dataplus._M_p != &local_6618.m_name.field_2) {
      operator_delete(local_6618.m_name._M_dataplus._M_p,
                      local_6618.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68e8._M_dataplus._M_p != &local_68e8.field_2) {
      operator_delete(local_68e8._M_dataplus._M_p,local_68e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68c8._M_dataplus._M_p != &local_68c8.field_2) {
      operator_delete(local_68c8._M_dataplus._M_p,local_68c8.field_2._M_allocated_capacity + 1);
    }
    tcu::TestContext::setTestResult
              ((pFVar4->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_68a0);
  tcu::Surface::~Surface(&local_6980);
  tcu::Surface::~Surface(&local_6968);
  sglr::ReferenceContext::~ReferenceContext(&local_61e8);
  tcu::TextureLevel::~TextureLevel(&local_63d0.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_63d0.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_63d0.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_63f0._M_p != &local_63e0) {
    operator_delete(local_63f0._M_p,
                    CONCAT71(local_63e0._M_allocated_capacity._1_7_,local_63e0._M_local_buf[0]) + 1)
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6408);
  sglr::GLContext::~GLContext(&local_6358);
  return;
}

Assistant:

void FillTest::testRender (void)
{
	using tcu::TestLog;

	const int						numSamples	= 1;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(glesContext);
	glesContext.readPixels(testSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(refContext);
	refContext.readPixels(refSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// check overdraw
	{
		bool				overdrawOk;
		tcu::Surface		outputImage(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Checking for overdraw " << TestLog::EndMessage;
		overdrawOk = checkHalfFilledImageOverdraw(log, m_context.getRenderTarget(), testSurface.getAccess(), outputImage.getAccess());

		if (!overdrawOk)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("InvalidPixels", "Invalid pixels", outputImage.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got overdraw." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got overdraw");
		}
	}

	// compare & check missing pixels
	{
		const int			kernelRadius	= 1;
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		blitImageOnBlackSurface(refSurface.getAccess(), refSurface.getAccess()); // makes images look right in Candy

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}